

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

uint __thiscall cmCTestGIT::GetGitVersion(cmCTestGIT *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint v [4];
  string version;
  char *git_version [3];
  OutputLogger version_err;
  OneLineParser version_out;
  undefined8 local_e8;
  undefined8 uStack_e0;
  string local_d8;
  pointer local_b8;
  char *local_b0;
  undefined8 local_a8;
  OutputLogger local_a0;
  OneLineParser local_60;
  
  uVar3 = this->CurrentGitVersion;
  if (uVar3 == 0) {
    local_b8 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    local_b0 = "--version";
    local_a8 = 0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    OneLineParser::OneLineParser(&local_60,this,"version-out> ",&local_d8);
    cmProcessTools::OutputLogger::OutputLogger
              (&local_a0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"version-err> ");
    local_e8 = 0;
    uStack_e0 = 0;
    bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,&local_b8,(OutputParser *)&local_60,
                                (OutputParser *)&local_a0,(char *)0x0,Auto);
    if (bVar1) {
      iVar2 = __isoc99_sscanf(local_d8._M_dataplus._M_p,"git version %u.%u.%u.%u",&local_e8,
                              (long)&local_e8 + 4,&uStack_e0,(long)&uStack_e0 + 4);
      if (2 < iVar2) {
        this->CurrentGitVersion =
             (int)local_e8 * 10000000 + local_e8._4_4_ * 100000 + uStack_e0._4_4_ +
             (int)uStack_e0 * 1000;
      }
    }
    local_a0.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_007830e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.super_LineParser.Line._M_dataplus._M_p !=
        &local_a0.super_LineParser.Line.field_2) {
      operator_delete(local_a0.super_LineParser.Line._M_dataplus._M_p,
                      local_a0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_60.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_007830e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.super_LineParser.Line._M_dataplus._M_p !=
        &local_60.super_LineParser.Line.field_2) {
      operator_delete(local_60.super_LineParser.Line._M_dataplus._M_p,
                      local_60.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    uVar3 = this->CurrentGitVersion;
  }
  return uVar3;
}

Assistant:

unsigned int cmCTestGIT::GetGitVersion()
{
  if (!this->CurrentGitVersion) {
    const char* git = this->CommandLineTool.c_str();
    char const* git_version[] = { git, "--version", CM_NULLPTR };
    std::string version;
    OneLineParser version_out(this, "version-out> ", version);
    OutputLogger version_err(this->Log, "version-err> ");
    unsigned int v[4] = { 0, 0, 0, 0 };
    if (this->RunChild(git_version, &version_out, &version_err) &&
        sscanf(version.c_str(), "git version %u.%u.%u.%u", &v[0], &v[1], &v[2],
               &v[3]) >= 3) {
      this->CurrentGitVersion = cmCTestGITVersion(v[0], v[1], v[2], v[3]);
    }
  }
  return this->CurrentGitVersion;
}